

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_utils.cpp
# Opt level: O0

uint8_t * zmq_z85_decode(uint8_t *dest_,char *string_)

{
  uint uVar1;
  size_t sVar2;
  int *piVar3;
  uint uVar4;
  char *in_RSI;
  uint8_t *in_RDI;
  uint divisor;
  uint32_t summand;
  uint8_t index;
  size_t src_len;
  uint32_t value;
  uint char_nbr;
  uint byte_nbr;
  uint local_3c;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  local_1c = 0;
  local_20 = 0;
  local_24 = 0;
  sVar2 = strlen(in_RSI);
  if ((4 < sVar2) && (sVar2 % 5 == 0)) {
    while (in_RSI[local_20] != '\0') {
      if (0x3030303 < local_24) goto LAB_0021c119;
      uVar4 = local_20 + 1;
      if (((0x5f < (byte)(in_RSI[local_20] - 0x20U)) ||
          (uVar1 = (uint)decoder[(byte)(in_RSI[local_20] - 0x20U)], uVar1 == 0xff)) ||
         (local_24 * -0x55 - 1 < uVar1)) goto LAB_0021c119;
      local_24 = uVar1 + local_24 * 0x55;
      local_20 = uVar4;
      if (uVar4 % 5 == 0) {
        for (local_3c = 0x1000000; local_3c != 0; local_3c = local_3c >> 8) {
          in_RDI[local_1c] = (uint8_t)(local_24 / local_3c);
          local_1c = local_1c + 1;
        }
        local_24 = 0;
      }
    }
    if (local_20 % 5 == 0) {
      return in_RDI;
    }
  }
LAB_0021c119:
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  return (uint8_t *)0x0;
}

Assistant:

uint8_t *zmq_z85_decode (uint8_t *dest_, const char *string_)
{
    unsigned int byte_nbr = 0;
    unsigned int char_nbr = 0;
    uint32_t value = 0;
    size_t src_len = strlen (string_);

    if (src_len < 5 || src_len % 5 != 0)
        goto error_inval;

    while (string_[char_nbr]) {
        //  Accumulate value in base 85
        if (UINT32_MAX / 85 < value) {
            //  Invalid z85 encoding, represented value exceeds 0xffffffff
            goto error_inval;
        }
        value *= 85;
        const uint8_t index = string_[char_nbr++] - 32;
        if (index >= sizeof (decoder)) {
            //  Invalid z85 encoding, character outside range
            goto error_inval;
        }
        const uint32_t summand = decoder[index];
        if (summand == 0xFF || summand > (UINT32_MAX - value)) {
            //  Invalid z85 encoding, invalid character or represented value exceeds 0xffffffff
            goto error_inval;
        }
        value += summand;
        if (char_nbr % 5 == 0) {
            //  Output value in base 256
            unsigned int divisor = 256 * 256 * 256;
            while (divisor) {
                dest_[byte_nbr++] = value / divisor % 256;
                divisor /= 256;
            }
            value = 0;
        }
    }
    if (char_nbr % 5 != 0) {
        goto error_inval;
    }
    assert (byte_nbr == strlen (string_) * 4 / 5);
    return dest_;

error_inval:
    errno = EINVAL;
    return NULL;
}